

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall duckdb::ParquetWriter::Flush(ParquetWriter *this,ColumnDataCollection *buffer)

{
  PreparedRowGroup prepared_row_group;
  PreparedRowGroup local_90;
  
  if (buffer->count != 0) {
    PreparedRowGroup::PreparedRowGroup(&local_90);
    PrepareRowGroup(this,buffer,&local_90);
    ColumnDataCollection::Reset(buffer);
    FlushRowGroup(this,&local_90);
    PreparedRowGroup::~PreparedRowGroup(&local_90);
  }
  return;
}

Assistant:

void ParquetWriter::Flush(ColumnDataCollection &buffer) {
	if (buffer.Count() == 0) {
		return;
	}

	PreparedRowGroup prepared_row_group;
	PrepareRowGroup(buffer, prepared_row_group);
	buffer.Reset();

	FlushRowGroup(prepared_row_group);
}